

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O1

void png_do_packswap(png_row_infop row_info,png_bytep row)

{
  byte bVar1;
  byte *pbVar2;
  png_byte *ppVar3;
  
  bVar1 = row_info->bit_depth;
  if (bVar1 < 8) {
    if (bVar1 == 1) {
      ppVar3 = "";
    }
    else if (bVar1 == 4) {
      ppVar3 = "";
    }
    else {
      if (bVar1 != 2) {
        return;
      }
      ppVar3 = "";
    }
    if (0 < (long)row_info->rowbytes) {
      pbVar2 = row + row_info->rowbytes;
      do {
        *row = ppVar3[*row];
        row = row + 1;
      } while (row < pbVar2);
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_packswap(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_packswap");

   if (row_info->bit_depth < 8)
   {
      png_bytep rp;
      png_const_bytep end, table;

      end = row + row_info->rowbytes;

      if (row_info->bit_depth == 1)
         table = onebppswaptable;

      else if (row_info->bit_depth == 2)
         table = twobppswaptable;

      else if (row_info->bit_depth == 4)
         table = fourbppswaptable;

      else
         return;

      for (rp = row; rp < end; rp++)
         *rp = table[*rp];
   }
}